

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gcpio_compat.c
# Opt level: O2

void test_gcpio_compat(void)

{
  wchar_t wVar1;
  char *se;
  char *se_00;
  char *se_01;
  char *se_02;
  char *from;
  char *from_00;
  char *from_01;
  char *from_02;
  bool bVar2;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_gcpio_compat.c"
                  ,L'A',L'\0');
  wVar1 = canSymlink();
  bVar2 = wVar1 == L'\0';
  from_00 = "test_gcpio_compat_ref.bin";
  if (bVar2) {
    from_00 = "test_gcpio_compat_ref_nosym.bin";
  }
  from = "test_gcpio_compat_ref.crc";
  if (bVar2) {
    from = "test_gcpio_compat_ref_nosym.crc";
  }
  from_01 = "test_gcpio_compat_ref.newc";
  if (bVar2) {
    from_01 = "test_gcpio_compat_ref_nosym.newc";
  }
  from_02 = "test_gcpio_compat_ref.ustar";
  if (bVar2) {
    from_02 = "test_gcpio_compat_ref_nosym.ustar";
  }
  unpack_test(from_00,"1 block\n",se);
  unpack_test(from,"2 blocks\n",se_00);
  unpack_test(from_01,"2 blocks\n",se_01);
  unpack_test(from_02,"7 blocks\n",se_02);
  return;
}

Assistant:

DEFINE_TEST(test_gcpio_compat)
{
	assertUmask(0);

	/* Dearchive sample files with a variety of options. */
	if (canSymlink()) {
		unpack_test("test_gcpio_compat_ref.bin",
		    "--no-preserve-owner", "1 block\n");
		unpack_test("test_gcpio_compat_ref.crc",
		    "--no-preserve-owner", "2 blocks\n");
		unpack_test("test_gcpio_compat_ref.newc",
		    "--no-preserve-owner", "2 blocks\n");
		/* gcpio-2.9 only reads 6 blocks here */
		unpack_test("test_gcpio_compat_ref.ustar",
		    "--no-preserve-owner", "7 blocks\n");
	} else {
		unpack_test("test_gcpio_compat_ref_nosym.bin",
		    "--no-preserve-owner", "1 block\n");
		unpack_test("test_gcpio_compat_ref_nosym.crc",
		    "--no-preserve-owner", "2 blocks\n");
		unpack_test("test_gcpio_compat_ref_nosym.newc",
		    "--no-preserve-owner", "2 blocks\n");
		/* gcpio-2.9 only reads 6 blocks here */
		unpack_test("test_gcpio_compat_ref_nosym.ustar",
		    "--no-preserve-owner", "7 blocks\n");
	}
}